

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utilities.cpp
# Opt level: O3

void __thiscall ThreadedImageSaver::enqueue(ThreadedImageSaver *this,Image *img,path *path)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  
  __mutex = &this->mtx;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    std::
    vector<std::pair<Image,std::filesystem::__cxx11::path>,std::allocator<std::pair<Image,std::filesystem::__cxx11::path>>>
    ::emplace_back<Image,std::filesystem::__cxx11::path>
              ((vector<std::pair<Image,std::filesystem::__cxx11::path>,std::allocator<std::pair<Image,std::filesystem::__cxx11::path>>>
                *)&this->images,img,path);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::condition_variable::notify_one();
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void ThreadedImageSaver::enqueue(Image img, fs::path path) {
	{
		std::lock_guard<std::mutex> l(mtx);
		images.emplace_back(std::move(img), std::move(path));
	}
	cv.notify_one();
}